

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PretransformVertices.cpp
# Opt level: O3

void __thiscall
Assimp::PretransformVertices::ComputeAbsoluteTransform(PretransformVertices *this,aiNode *pcNode)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  aiNode *paVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  ulong uVar34;
  
  paVar17 = pcNode->mParent;
  if (paVar17 != (aiNode *)0x0) {
    fVar1 = (paVar17->mTransformation).a1;
    fVar2 = (paVar17->mTransformation).a2;
    fVar3 = (paVar17->mTransformation).a3;
    fVar4 = (paVar17->mTransformation).a4;
    fVar18 = (pcNode->mTransformation).a1;
    fVar19 = (pcNode->mTransformation).a2;
    fVar20 = (pcNode->mTransformation).a3;
    fVar21 = (pcNode->mTransformation).a4;
    fVar22 = (pcNode->mTransformation).b1;
    fVar23 = (pcNode->mTransformation).b2;
    fVar24 = (pcNode->mTransformation).b3;
    fVar25 = (pcNode->mTransformation).b4;
    fVar26 = (pcNode->mTransformation).c1;
    fVar27 = (pcNode->mTransformation).c2;
    fVar28 = (pcNode->mTransformation).c3;
    fVar29 = (pcNode->mTransformation).c4;
    fVar30 = (pcNode->mTransformation).d1;
    fVar31 = (pcNode->mTransformation).d2;
    fVar32 = (pcNode->mTransformation).d3;
    fVar33 = (pcNode->mTransformation).d4;
    fVar5 = (paVar17->mTransformation).b2;
    fVar6 = (paVar17->mTransformation).b1;
    fVar7 = (paVar17->mTransformation).b3;
    fVar8 = (paVar17->mTransformation).b4;
    fVar9 = (paVar17->mTransformation).c2;
    fVar10 = (paVar17->mTransformation).c1;
    fVar11 = (paVar17->mTransformation).c3;
    fVar12 = (paVar17->mTransformation).c4;
    fVar13 = (paVar17->mTransformation).d2;
    fVar14 = (paVar17->mTransformation).d1;
    fVar15 = (paVar17->mTransformation).d3;
    fVar16 = (paVar17->mTransformation).d4;
    (pcNode->mTransformation).a1 = fVar4 * fVar30 + fVar3 * fVar26 + fVar1 * fVar18 + fVar2 * fVar22
    ;
    (pcNode->mTransformation).a2 = fVar4 * fVar31 + fVar3 * fVar27 + fVar1 * fVar19 + fVar2 * fVar23
    ;
    (pcNode->mTransformation).a3 = fVar4 * fVar32 + fVar3 * fVar28 + fVar1 * fVar20 + fVar2 * fVar24
    ;
    (pcNode->mTransformation).a4 = fVar4 * fVar33 + fVar3 * fVar29 + fVar1 * fVar21 + fVar2 * fVar25
    ;
    (pcNode->mTransformation).b1 = fVar8 * fVar30 + fVar7 * fVar26 + fVar6 * fVar18 + fVar5 * fVar22
    ;
    (pcNode->mTransformation).b2 = fVar8 * fVar31 + fVar7 * fVar27 + fVar6 * fVar19 + fVar5 * fVar23
    ;
    (pcNode->mTransformation).b3 = fVar8 * fVar32 + fVar7 * fVar28 + fVar6 * fVar20 + fVar5 * fVar24
    ;
    (pcNode->mTransformation).b4 = fVar8 * fVar33 + fVar7 * fVar29 + fVar6 * fVar21 + fVar5 * fVar25
    ;
    (pcNode->mTransformation).c1 =
         fVar12 * fVar30 + fVar11 * fVar26 + fVar10 * fVar18 + fVar9 * fVar22;
    (pcNode->mTransformation).c2 =
         fVar12 * fVar31 + fVar11 * fVar27 + fVar10 * fVar19 + fVar9 * fVar23;
    (pcNode->mTransformation).c3 =
         fVar12 * fVar32 + fVar11 * fVar28 + fVar10 * fVar20 + fVar9 * fVar24;
    (pcNode->mTransformation).c4 =
         fVar12 * fVar33 + fVar11 * fVar29 + fVar10 * fVar21 + fVar9 * fVar25;
    (pcNode->mTransformation).d1 =
         fVar16 * fVar30 + fVar15 * fVar26 + fVar14 * fVar18 + fVar13 * fVar22;
    (pcNode->mTransformation).d2 =
         fVar16 * fVar31 + fVar15 * fVar27 + fVar14 * fVar19 + fVar13 * fVar23;
    (pcNode->mTransformation).d3 =
         fVar16 * fVar32 + fVar15 * fVar28 + fVar14 * fVar20 + fVar13 * fVar24;
    (pcNode->mTransformation).d4 =
         fVar16 * fVar33 + fVar15 * fVar29 + fVar14 * fVar21 + fVar13 * fVar25;
  }
  if (pcNode->mNumChildren != 0) {
    uVar34 = 0;
    do {
      ComputeAbsoluteTransform(this,pcNode->mChildren[uVar34]);
      uVar34 = uVar34 + 1;
    } while (uVar34 < pcNode->mNumChildren);
  }
  return;
}

Assistant:

void PretransformVertices::ComputeAbsoluteTransform(aiNode *pcNode) {
	if (pcNode->mParent) {
		pcNode->mTransformation = pcNode->mParent->mTransformation * pcNode->mTransformation;
	}

	for (unsigned int i = 0; i < pcNode->mNumChildren; ++i) {
		ComputeAbsoluteTransform(pcNode->mChildren[i]);
	}
}